

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData
          (PerspectiveCameraData *this,PerspectiveCameraData *param_1)

{
  undefined8 uVar1;
  PerspectiveCameraData *param_1_local;
  PerspectiveCameraData *this_local;
  
  uVar1 = *(undefined8 *)((long)&(param_1->from).field_0 + 8);
  *(undefined8 *)&(this->from).field_0 = *(undefined8 *)&(param_1->from).field_0;
  *(undefined8 *)((long)&(this->from).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->to).field_0 + 8);
  *(undefined8 *)&(this->to).field_0 = *(undefined8 *)&(param_1->to).field_0;
  *(undefined8 *)((long)&(this->to).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(param_1->up).field_0 + 8);
  *(undefined8 *)&(this->up).field_0 = *(undefined8 *)&(param_1->up).field_0;
  *(undefined8 *)((long)&(this->up).field_0 + 8) = uVar1;
  this->fov = param_1->fov;
  return;
}

Assistant:

PerspectiveCameraData()
        : from(1,0,0), to(0,0,0), up(0,1,0), fov(30) {}